

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void CVmBifTADS::re_group(uint argc)

{
  int iVar1;
  vm_obj_id_t obj;
  char *pcVar2;
  vm_val_t *this;
  vm_obj_id_t strobj;
  utf8_ptr p;
  int start_byte_ofs;
  char *dst;
  char buf [17];
  char *last_str;
  re_group_register_conflict *reg;
  int groupno;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  vm_obj_id_t objval;
  char **dstp;
  char *apcStack_36 [3];
  char *local_18;
  re_group_register_conflict *local_10;
  int local_8;
  
  CVmBif::check_argc(0,0x2f91c6);
  local_8 = CVmBif::pop_int_val();
  if (local_8 == 0) {
    local_10 = CRegexSearcherSimple::get_last_match(G_bif_tads_globals_X->rex_searcher);
  }
  else {
    if ((local_8 < 1) || (10 < local_8)) {
      err_throw(0);
    }
    in_stack_ffffffffffffffa8 = local_8 + -1;
    local_8 = in_stack_ffffffffffffffa8;
    iVar1 = CRegexSearcherSimple::get_group_cnt(G_bif_tads_globals_X->rex_searcher);
    if (iVar1 <= in_stack_ffffffffffffffa8) {
      CVmBif::retval_nil();
      return;
    }
    local_10 = CRegexSearcherSimple::get_group_reg(G_bif_tads_globals_X->rex_searcher,local_8);
  }
  local_18 = vm_val_t::get_as_string
                       ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (((local_18 == (char *)0x0) || (local_10->start_ofs == -1)) || (local_10->end_ofs == -1)) {
    CVmBif::retval_nil();
  }
  else {
    vmb_put_len((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    dstp = apcStack_36;
    objval = local_10->start_ofs;
    utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    utf8_ptr::len((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    put_list_int(dstp,CONCAT44(objval,in_stack_ffffffffffffffb8));
    pcVar2 = utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffb0);
    utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffffb0,pcVar2 + (int)objval);
    utf8_ptr::len((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    put_list_int(dstp,CONCAT44(objval,in_stack_ffffffffffffffb8));
    utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffb0);
    obj = CVmObjString::create
                    ((int)((ulong)dstp >> 0x20),(char *)CONCAT44(objval,in_stack_ffffffffffffffb8),
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    put_list_obj(dstp,objval);
    this = CVmStack::push();
    vm_val_t::set_obj(this,obj);
    CVmObjList::create(in_stack_ffffffffffffffb4,(char *)CONCAT44(obj,in_stack_ffffffffffffffa8));
    CVmBif::retval_obj(0);
    CVmStack::discard();
  }
  return;
}

Assistant:

void CVmBifTADS::re_group(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* get the group number to retrieve */
    int groupno = pop_int_val(vmg0_);

    /* group 0 is the special group for the overall match */
    const re_group_register *reg;
    if (groupno == 0)
    {
        /* get the special register for the overall match */
        reg = G_bif_tads_globals->rex_searcher->get_last_match();
    }
    else
    {
        /* make sure it's in range */
        if (groupno < 1 || groupno > RE_GROUP_REG_CNT)
            err_throw(VMERR_BAD_VAL_BIF);
        
        /* adjust from a 1-base to a 0-base */
        --groupno;
        
        /* if the group doesn't exist in the pattern, return nil */
        if (groupno >= G_bif_tads_globals->rex_searcher->get_group_cnt())
        {
            retval_nil(vmg0_);
            return;
        }

        /* get the group register */
        reg = G_bif_tads_globals->rex_searcher->get_group_reg(groupno);
    }